

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QByteArray,QFont>::emplaceValue<QFont_const&>
          (Node<QByteArray,_QFont> *this,QFont *args)

{
  QFont *in_RSI;
  QFont *in_RDI;
  long in_FS_OFFSET;
  QFont *this_00;
  QFont local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = local_18;
  QFont::QFont(this_00,in_RSI);
  QFont::operator=(this_00,in_RDI);
  QFont::~QFont(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }